

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwMaximizeWindow(GLFWwindow *handle)

{
  Atom AVar1;
  Atom AVar2;
  Atom AVar3;
  _GLFWwindow *window;
  undefined4 auStack_f0 [8];
  undefined8 uStack_d0;
  Atom AStack_c8;
  undefined4 uStack_c0;
  undefined8 uStack_b8;
  Atom AStack_b0;
  Atom AStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  
  AVar3 = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
  AVar2 = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
  AVar1 = _glfw.x11.NET_WM_STATE;
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/src/window.c"
                  ,0x297,"void glfwMaximizeWindow(GLFWwindow *)");
  }
  if (_glfw.initialized != 0) {
    if (*(long *)(handle + 0x40) != 0) {
      return;
    }
    if (_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ != 0 &&
        (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT != 0 && _glfw.x11.NET_WM_STATE != 0)) {
      memset(auStack_f0,0,0xc0);
      auStack_f0[0] = 0x21;
      uStack_d0 = *(undefined8 *)(handle + 800);
      uStack_c0 = 0x20;
      AStack_c8 = AVar1;
      uStack_b8 = 1;
      AStack_b0 = AVar2;
      AStack_a8 = AVar3;
      uStack_a0 = 1;
      uStack_98 = 0;
      XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,auStack_f0);
      XFlush(_glfw.x11.display);
    }
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwMaximizeWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformMaximizeWindow(window);
}